

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScenePreprocessor.cpp
# Opt level: O3

void __thiscall Assimp::ScenePreprocessor::ProcessScene(ScenePreprocessor *this)

{
  aiMaterial **ppaVar1;
  aiMaterial *this_00;
  Logger *this_01;
  aiScene *paVar2;
  ScenePreprocessor *this_02;
  ulong uVar3;
  undefined8 local_428;
  undefined4 local_420;
  aiString local_41c;
  
  paVar2 = this->scene;
  if (paVar2 != (aiScene *)0x0) {
    if (paVar2->mNumMeshes != 0) {
      uVar3 = 0;
      this_02 = this;
      do {
        ProcessMesh(this_02,paVar2->mMeshes[uVar3]);
        uVar3 = uVar3 + 1;
        paVar2 = this->scene;
      } while (uVar3 < paVar2->mNumMeshes);
    }
    if (paVar2->mNumAnimations != 0) {
      uVar3 = 0;
      do {
        ProcessAnimation(this,paVar2->mAnimations[uVar3]);
        uVar3 = uVar3 + 1;
        paVar2 = this->scene;
      } while (uVar3 < paVar2->mNumAnimations);
    }
    if ((paVar2->mNumMaterials == 0) && (paVar2->mNumMeshes != 0)) {
      ppaVar1 = (aiMaterial **)operator_new__(0x10);
      paVar2->mMaterials = ppaVar1;
      memset(local_41c.data + 0x10,0x1b,0x3f0);
      this_00 = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(this_00);
      this->scene->mMaterials[this->scene->mNumMaterials] = this_00;
      local_428 = 0x3f19999a3f19999a;
      local_420 = 0x3f19999a;
      aiMaterial::AddBinaryProperty(this_00,&local_428,0xc,"$clr.diffuse",0,0,aiPTI_Float);
      local_41c.length = 0xf;
      builtin_strncpy(local_41c.data,"DefaultMaterial",0x10);
      aiMaterial::AddProperty(this_00,&local_41c,"?mat.name",0,0);
      this_01 = DefaultLogger::get();
      Logger::debug(this_01,"ScenePreprocessor: Adding default material \'DefaultMaterial\'");
      paVar2 = this->scene;
      if (paVar2->mNumMeshes != 0) {
        uVar3 = 0;
        do {
          paVar2->mMeshes[uVar3]->mMaterialIndex = paVar2->mNumMaterials;
          uVar3 = uVar3 + 1;
          paVar2 = this->scene;
        } while (uVar3 < paVar2->mNumMeshes);
      }
      paVar2->mNumMaterials = paVar2->mNumMaterials + 1;
    }
    return;
  }
  __assert_fail("scene != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/ScenePreprocessor.cpp"
                ,0x36,"void Assimp::ScenePreprocessor::ProcessScene()");
}

Assistant:

void ScenePreprocessor::ProcessScene ()
{
    ai_assert(scene != NULL);

    // Process all meshes
    for (unsigned int i = 0; i < scene->mNumMeshes;++i)
        ProcessMesh(scene->mMeshes[i]);

    // - nothing to do for nodes for the moment
    // - nothing to do for textures for the moment
    // - nothing to do for lights for the moment
    // - nothing to do for cameras for the moment

    // Process all animations
    for (unsigned int i = 0; i < scene->mNumAnimations;++i)
        ProcessAnimation(scene->mAnimations[i]);

    // Generate a default material if none was specified
    if (!scene->mNumMaterials && scene->mNumMeshes) {
        scene->mMaterials      = new aiMaterial*[2];
        aiMaterial* helper;

        aiString name;

        scene->mMaterials[scene->mNumMaterials] = helper = new aiMaterial();
        aiColor3D clr(0.6f,0.6f,0.6f);
        helper->AddProperty(&clr,1,AI_MATKEY_COLOR_DIFFUSE);

        // setup the default name to make this material identifiable
        name.Set(AI_DEFAULT_MATERIAL_NAME);
        helper->AddProperty(&name,AI_MATKEY_NAME);

        ASSIMP_LOG_DEBUG("ScenePreprocessor: Adding default material \'" AI_DEFAULT_MATERIAL_NAME  "\'");

        for (unsigned int i = 0; i < scene->mNumMeshes;++i) {
            scene->mMeshes[i]->mMaterialIndex = scene->mNumMaterials;
        }

        scene->mNumMaterials++;
    }
}